

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

nng_err nni_http_set_uri(nng_http *conn,char *uri,char *query)

{
  char *__s;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  nng_err nVar5;
  char *fmt;
  ulong local_40;
  
  if (query == (char *)0x0) {
    local_40 = strlen(uri);
    fmt = "%s%s";
    query = "";
  }
  else {
    pcVar2 = strchr(uri,0x3f);
    fmt = "%s&%s";
    if (pcVar2 == (char *)0x0) {
      fmt = "%s?%s";
    }
    sVar3 = strlen(uri);
    sVar4 = strlen(query);
    local_40 = sVar4 + sVar3 + 1;
  }
  pcVar2 = conn->uri;
  if (((pcVar2 != (char *)0x0) && (iVar1 = strcmp(uri,pcVar2), iVar1 == 0)) && (*query == '\0')) {
    return NNG_OK;
  }
  __s = conn->ubuf;
  if (pcVar2 != __s && pcVar2 != (char *)0x0) {
    nni_strfree(pcVar2);
  }
  if (local_40 < 200) {
    nVar5 = NNG_OK;
    snprintf(__s,200,fmt,uri,query);
    conn->uri = __s;
  }
  else {
    iVar1 = nni_asprintf(&conn->uri,fmt,uri,query);
    nVar5 = (uint)(iVar1 != 0) * 2;
  }
  return nVar5;
}

Assistant:

nng_err
nni_http_set_uri(nng_http *conn, const char *uri, const char *query)
{
	size_t      needed;
	const char *fmt;

	if (query != NULL) {
		fmt    = strchr(uri, '?') != NULL ? "%s&%s" : "%s?%s";
		needed = strlen(uri) + strlen(query) + 1;
	} else {
		fmt    = "%s%s";
		query  = "";
		needed = strlen(uri);
	}

	if (conn->uri != NULL && (strcmp(uri, conn->uri) == 0) &&
	    strlen(query) == 0) {
		// no change, do nothing
		return (NNG_OK);
	}
	if (conn->uri != NULL && conn->uri != conn->ubuf) {
		nni_strfree(conn->uri);
	}

	// fast path, small size URI fits in our buffer
	if (needed < sizeof(conn->ubuf)) {
		snprintf(conn->ubuf, sizeof(conn->ubuf), fmt, uri, query);
		conn->uri = conn->ubuf;
		return (NNG_OK);
	}

	// too big, we have to allocate it (slow path)
	if (nni_asprintf(&conn->uri, fmt, uri, query) != 0) {
		return (NNG_ENOMEM);
	}
	return (NNG_OK);
}